

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

Real __thiscall NavierStokesBase::estTimeStep(NavierStokesBase *this)

{
  double dVar1;
  initializer_list<int> iVar2;
  initializer_list<int> iVar3;
  FArrayBox *pFVar4;
  Real RVar5;
  undefined1 *puVar6;
  bool bVar7;
  int iVar8;
  MFIter *mfi_00;
  FArrayBox *pFVar9;
  double *pdVar10;
  Print *this_00;
  long *in_RDI;
  int k_1;
  int k;
  int IOProc;
  int lev_1;
  int ratio_1;
  Real factor_1;
  int idim;
  Real *dx;
  Array4<double> *force;
  Array4<double> *gradp;
  Array4<double> *rho;
  FArrayBox *tforces_fab;
  Real cur_time;
  Box *bx;
  MFIter mfi;
  MultiFab tforces;
  MultiFab *Gp;
  Vector<double,_std::allocator<double>_> f_max;
  Vector<double,_std::allocator<double>_> u_max;
  MultiFab *S_new;
  Real estdt;
  Real small;
  int lev;
  int ratio;
  Real factor;
  allocator_type *in_stack_ffffffffffffeb38;
  undefined4 in_stack_ffffffffffffeb40;
  int in_stack_ffffffffffffeb44;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffeb48;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffeb50;
  StateData *in_stack_ffffffffffffeb60;
  FabArrayBase *in_stack_ffffffffffffeb68;
  Print *in_stack_ffffffffffffeb70;
  BoxArray *in_stack_ffffffffffffeb78;
  anon_class_192_3_37f38c7e *in_stack_ffffffffffffeb80;
  Box *in_stack_ffffffffffffeb88;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffeb90;
  MFIter *in_stack_ffffffffffffeba0;
  Print *in_stack_ffffffffffffebb0;
  undefined8 in_stack_ffffffffffffebb8;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffebc0;
  MultiFab *in_stack_ffffffffffffebc8;
  int local_e9c;
  int local_9f4;
  int local_6d8;
  int local_6d4;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  int local_6b4;
  Real *local_6b0;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined4 local_69c;
  undefined4 *local_698;
  undefined8 local_690;
  undefined1 local_658 [64];
  undefined1 auStack_618 [64];
  undefined1 auStack_5d8 [64];
  undefined1 local_598 [64];
  undefined1 *local_558;
  undefined1 local_550 [64];
  undefined1 *local_510;
  undefined1 local_508 [64];
  undefined1 *local_4c8;
  undefined1 local_4bb;
  undefined1 local_4ba;
  undefined1 local_4b9;
  FArrayBox *local_330;
  Real local_328;
  undefined1 local_31c [28];
  undefined1 *local_300;
  FabArray<amrex::FArrayBox> local_2f8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 *local_d8;
  undefined8 local_d0;
  MultiFab *local_98;
  MultiFab *local_40;
  double local_38 [2];
  int local_28;
  int local_24;
  double local_20;
  Real local_10;
  char *local_8;
  
  if (fixed_dt <= 0.0) {
    local_38[1] = 1e-08;
    local_38[0] = 1e+20;
    local_40 = amrex::AmrLevel::get_new_data
                         ((AmrLevel *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                          (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20));
    std::allocator<double>::allocator((allocator<double> *)0x7b9ddb);
    amrex::Vector<double,_std::allocator<double>_>::vector
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
               (size_type)in_stack_ffffffffffffeb38,(allocator_type *)0x7b9df5);
    std::allocator<double>::~allocator((allocator<double> *)0x7b9e04);
    std::allocator<double>::allocator((allocator<double> *)0x7b9e19);
    amrex::Vector<double,_std::allocator<double>_>::vector
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
               (size_type)in_stack_ffffffffffffeb38,(allocator_type *)0x7b9e33);
    std::allocator<double>::~allocator((allocator<double> *)0x7b9e42);
    local_98 = amrex::AmrLevel::get_new_data
                         ((AmrLevel *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                          (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20));
    local_e4 = 0;
    local_e0 = 1;
    local_dc = 2;
    local_d8 = &local_e4;
    local_d0 = 3;
    std::allocator<int>::allocator((allocator<int> *)0x7b9ebe);
    iVar2._M_len = (size_type)in_stack_ffffffffffffeb50;
    iVar2._M_array = (iterator)in_stack_ffffffffffffeb48;
    amrex::Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),iVar2,
               in_stack_ffffffffffffeb38);
    amrex::MultiFab::norm0
              (in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,
               (int)((ulong)in_stack_ffffffffffffebb8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffebb8 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffebb8 >> 0x10,0));
    amrex::Vector<double,_std::allocator<double>_>::operator=
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
               (Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeb38);
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x7b9f39);
    amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x7b9f46)
    ;
    std::allocator<int>::~allocator((allocator<int> *)0x7b9f53);
    local_2f8.super_FabArrayBase.distributionMap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2f8.super_FabArrayBase.distributionMap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8.super_FabArrayBase.boxarray.m_simplified_list.
    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_2f8.super_FabArrayBase.boxarray.m_simplified_list.
    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8.super_FabArrayBase.indexArray.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x7b9faf);
    mfi_00 = (MFIter *)
             amrex::AmrLevel::Factory
                       ((AmrLevel *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               (DistributionMapping *)in_stack_ffffffffffffeb70,
               (int)((ulong)in_stack_ffffffffffffeb68 >> 0x20),(int)in_stack_ffffffffffffeb68,
               (MFInfo *)in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb90);
    amrex::MFInfo::~MFInfo((MFInfo *)0x7ba001);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68,
               SUB81((ulong)in_stack_ffffffffffffeb60 >> 0x38,0));
    while (bVar7 = amrex::MFIter::isValid((MFIter *)&local_2f8), bVar7) {
      amrex::MFIter::tilebox(in_stack_ffffffffffffeba0);
      local_300 = local_31c;
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),(size_type)mfi_00);
      local_328 = amrex::StateData::curTime(in_stack_ffffffffffffeb60);
      local_330 = amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)
                             CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),mfi_00);
      if (getForceVerbose != 0) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [4])mfi_00);
        local_4b9 = 10;
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char *)mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [19])mfi_00);
        local_4ba = 10;
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char *)mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [20])mfi_00);
        local_4bb = 10;
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char *)mfi_00);
        amrex::Print::~Print(in_stack_ffffffffffffebb0);
      }
      puVar6 = local_300;
      RVar5 = local_328;
      pFVar4 = local_330;
      in_stack_ffffffffffffeb48 = &local_2f8;
      pFVar9 = amrex::FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)
                          CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),mfi_00);
      mfi_00 = (MFIter *)
               amrex::FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)
                          CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),mfi_00);
      in_stack_ffffffffffffeb40 = 3;
      (**(code **)(*in_RDI + 0x150))(SUB84(RVar5,0),in_RDI,pFVar4,puVar6,0,3,pFVar9);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffeb50,(MFIter *)in_stack_ffffffffffffeb48,
                 in_stack_ffffffffffffeb44);
      local_4c8 = local_508;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffeb48,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
      local_510 = local_550;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffeb48,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
      local_558 = local_598;
      memcpy(local_658,local_4c8,0x3c);
      memcpy(auStack_618,local_510,0x3c);
      memcpy(auStack_5d8,local_558,0x3c);
      amrex::ParallelFor<NavierStokesBase::estTimeStep()::__0>
                (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80);
      amrex::MFIter::operator++((MFIter *)&local_2f8);
    }
    amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40));
    local_6a4 = 0;
    local_6a0 = 1;
    local_69c = 2;
    local_698 = &local_6a4;
    local_690 = 3;
    std::allocator<int>::allocator((allocator<int> *)0x7ba527);
    iVar3._M_len = (size_type)in_stack_ffffffffffffeb50;
    iVar3._M_array = (iterator)in_stack_ffffffffffffeb48;
    amrex::Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),iVar3,
               (allocator_type *)mfi_00);
    amrex::MultiFab::norm0
              (in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,
               (int)((ulong)in_stack_ffffffffffffebb8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffebb8 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffebb8 >> 0x10,0));
    amrex::Vector<double,_std::allocator<double>_>::operator=
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
               (Vector<double,_std::allocator<double>_> *)mfi_00);
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x7ba59a);
    amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x7ba5a7)
    ;
    std::allocator<int>::~allocator((allocator<int> *)0x7ba5b4);
    local_6b0 = amrex::CoordSys::CellSize((CoordSys *)(in_RDI + 2));
    for (local_6b4 = 0; local_6b4 < 3; local_6b4 = local_6b4 + 1) {
      pdVar10 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                          ((Vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                           (size_type)mfi_00);
      if (1e-08 < *pdVar10) {
        dVar1 = local_6b0[local_6b4];
        pdVar10 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                             (size_type)mfi_00);
        local_6c0 = dVar1 / *pdVar10;
        pdVar10 = std::min<double>(local_38,&local_6c0);
        local_38[0] = *pdVar10;
      }
      pdVar10 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                          ((Vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                           (size_type)mfi_00);
      if (1e-08 < *pdVar10) {
        dVar1 = local_6b0[local_6b4];
        pdVar10 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                            ((Vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                             (size_type)mfi_00);
        local_6c8 = sqrt((dVar1 + dVar1) / *pdVar10);
        pdVar10 = std::min<double>(local_38,&local_6c8);
        local_38[0] = *pdVar10;
      }
    }
    amrex::ParallelDescriptor::ReduceRealMin<double>(local_38);
    if (1e+20 <= local_38[0]) {
      if (init_dt <= 0.0) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [68])mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [77])mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [68])mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [53])mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                    *)mfi_00);
        amrex::Print::~Print(in_stack_ffffffffffffebb0);
        local_8 = "\n";
        amrex::Abort_host((char *)in_stack_ffffffffffffeb50);
      }
      else {
        local_6d0 = 1.0;
        if ((int)in_RDI[1] != 0) {
          local_6d4 = 1;
          for (local_6d8 = 1; local_6d8 <= (int)in_RDI[1]; local_6d8 = local_6d8 + 1) {
            iVar8 = amrex::Amr::nCycle((Amr *)CONCAT44(in_stack_ffffffffffffeb44,
                                                       in_stack_ffffffffffffeb40),
                                       (int)((ulong)mfi_00 >> 0x20));
            local_6d4 = iVar8 * local_6d4;
          }
          local_6d0 = 1.0 / (double)local_6d4;
        }
        local_38[0] = local_6d0 * init_dt;
      }
    }
    else {
      local_38[0] = local_38[0] * cfl;
    }
    if (verbose != 0) {
      iVar8 = amrex::ParallelDescriptor::IOProcessorNumber();
      pdVar10 = amrex::Vector<double,_std::allocator<double>_>::dataPtr
                          ((Vector<double,_std::allocator<double>_> *)0x7ba9e8);
      amrex::ParallelDescriptor::ReduceRealMax<double>(pdVar10,3,iVar8);
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
      this_00 = amrex::Print::operator<<
                          ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                           (char (*) [17])mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 (char (*) [7])mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 (int *)mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 (char (*) [9])mfi_00);
      amrex::Print::~Print(this_00);
      for (local_9f4 = 0; local_9f4 < 3; local_9f4 = local_9f4 + 1) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
        amrex::Vector<double,_std::allocator<double>_>::operator[]
                  ((Vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),(size_type)mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (double *)mfi_00);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [3])mfi_00);
        amrex::Print::~Print(this_00);
      }
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 (char *)mfi_00);
      amrex::Print::~Print(this_00);
      if (getForceVerbose != 0) {
        pdVar10 = amrex::Vector<double,_std::allocator<double>_>::dataPtr
                            ((Vector<double,_std::allocator<double>_> *)0x7babe1);
        amrex::ParallelDescriptor::ReduceRealMax<double>(pdVar10,3,iVar8);
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char (*) [16])mfi_00);
        amrex::Print::~Print(this_00);
        for (local_e9c = 0; local_e9c < 3; local_e9c = local_e9c + 1) {
          amrex::OutStream();
          amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
          amrex::Vector<double,_std::allocator<double>_>::operator[]
                    ((Vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),(size_type)mfi_00
                    );
          in_stack_ffffffffffffeb70 =
               amrex::Print::operator<<
                         ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                          (double *)mfi_00);
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                     (char (*) [3])mfi_00);
          amrex::Print::~Print(this_00);
        }
        in_stack_ffffffffffffeb68 = (FabArrayBase *)amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                   (char *)mfi_00);
        amrex::Print::~Print(this_00);
      }
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeb70,(ostream *)in_stack_ffffffffffffeb68);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 (char (*) [26])mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 (double *)mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)mfi_00);
      amrex::Print::~Print(this_00);
    }
    local_10 = local_38[0];
    amrex::MultiFab::~MultiFab((MultiFab *)0x7bae73);
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x7bae80);
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x7bae8d);
  }
  else {
    local_20 = 1.0;
    if ((int)in_RDI[1] != 0) {
      local_24 = 1;
      for (local_28 = 1; local_28 <= (int)in_RDI[1]; local_28 = local_28 + 1) {
        iVar8 = amrex::Amr::nCycle((Amr *)CONCAT44(in_stack_ffffffffffffeb44,
                                                   in_stack_ffffffffffffeb40),
                                   (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20));
        local_24 = iVar8 * local_24;
      }
      local_20 = 1.0 / (double)local_24;
    }
    local_10 = local_20 * fixed_dt;
  }
  return local_10;
}

Assistant:

Real
NavierStokesBase::estTimeStep ()
{
    BL_PROFILE("NavierStokesBase::estTimeStep()");

    if (fixed_dt > 0.0)
    {
        Real factor = 1.0;

        if (!(level == 0))
        {
            int ratio = 1;
            for (int lev = 1; lev <= level; lev++)
            {
                ratio *= parent->nCycle(lev);
            }
            factor = 1.0/Real(ratio);
        }

        return factor*fixed_dt;
    }

    const Real  small         = 1.0e-8;
    Real        estdt         = 1.0e+20;

    MultiFab&   S_new         = get_new_data(State_Type);

    Vector<Real> u_max(AMREX_SPACEDIM);
    Vector<Real> f_max(AMREX_SPACEDIM);

    MultiFab& Gp = get_new_data(Gradp_Type);

    //
    // Find local max of velocity
    //
    u_max = S_new.norm0({AMREX_D_DECL(0,1,2)},0,true,true);

    //
    // Compute forcing terms: in this case this means external forces and grad(p)
    // Viscous terms not included since Crack-Nicholson is unconditionally stable
    // so no need to account for explicit part of viscous term
    //
    MultiFab tforces(grids,dmap,AMREX_SPACEDIM,0,MFInfo(),Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const auto& bx          = mfi.tilebox();
       const auto  cur_time    = state[State_Type].curTime();
       auto& tforces_fab       = tforces[mfi];

       if (getForceVerbose) {
           amrex::Print() << "---" << '\n'
                          << "H - est Time Step:" << '\n'
                          << "Calling getForce..." << '\n';
       }
       getForce(tforces_fab,bx,0,AMREX_SPACEDIM,cur_time,S_new[mfi],S_new[mfi],Density,mfi);

       const auto& rho   = S_new.array(mfi,Density);
       const auto& gradp = Gp.array(mfi);
       const auto& force = tforces.array(mfi);
       amrex::ParallelFor(bx, [rho, gradp, force]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
          Real rho_inv = 1.0/rho(i,j,k);
          for (int n = 0; n < AMREX_SPACEDIM; n++) {
             force(i,j,k,n) -= gradp(i,j,k,n);
             force(i,j,k,n) *= rho_inv;
          }
       });
    }

    //
    // Find local max of tforces
    //
    f_max = tforces.norm0({AMREX_D_DECL(0,1,2)},0,true,true);

    //
    // Compute local estdt
    //
    const Real* dx = geom.CellSize();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (u_max[idim] > small)
        {
            estdt = std::min(estdt, dx[idim]/u_max[idim]);
        }

        if (f_max[idim] > small)
        {
            estdt = std::min(estdt, std::sqrt(2.0*dx[idim]/f_max[idim]));
        }
    }

    //
    // Reduce estimated dt by CFL factor and find global min
    //
    ParallelDescriptor::ReduceRealMin(estdt);

    if ( estdt < 1.0e+20) {
      //
      // timestep estimation successful
      //
      estdt = estdt * cfl;
    }
    else if (init_dt > 0 ) {
      //
      // use init_dt, scale for amr level
      //
      Real factor = 1.0;

      if (!(level == 0))
      {
         int ratio = 1;
         for (int lev = 1; lev <= level; lev++)
         {
           ratio *= parent->nCycle(lev);
         }
         factor = 1.0/Real(ratio);
      }

      estdt = factor*init_dt;
    } else {
      Print()<<"\nNavierStokesBase::estTimeStep() failed to provide a good timestep "
             <<"(probably because initial velocity field is zero with no external forcing).\n"
             <<"Use ns.init_dt to provide a reasonable timestep on coarsest level.\n"
             <<"Note that ns.init_shrink will be applied to init_dt."<<std::endl;
      amrex::Abort("\n");
    }

    if (verbose)
    {
        const int IOProc = ParallelDescriptor::IOProcessorNumber();
        ParallelDescriptor::ReduceRealMax(u_max.dataPtr(), AMREX_SPACEDIM, IOProc);

        amrex::Print() << "estTimeStep :: \n" << "LEV = " << level << " UMAX = ";
        for (int k = 0; k < AMREX_SPACEDIM; k++)
        {
            amrex::Print() << u_max[k] << "  ";
        }
        amrex::Print() << '\n';

        if (getForceVerbose) {
           ParallelDescriptor::ReduceRealMax(f_max.dataPtr(), AMREX_SPACEDIM, IOProc);
           amrex::Print() << "        FMAX = ";
           for (int k = 0; k < AMREX_SPACEDIM; k++)
           {
              amrex::Print() << f_max[k] << "  ";
           }
           amrex::Print() << '\n';
        }
        Print()<<"estimated timestep: dt = "<<estdt<<std::endl;
    }

    return estdt;
}